

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void template_conformglist(t_template *tfrom,t_template *tto,_glist *glist,int *conformaction)

{
  t_pd p_Var1;
  t_symbol *s;
  _glist *p_Var2;
  _array *a;
  t_template *ptVar3;
  _glist *x;
  _glist *p_Var4;
  long lVar5;
  t_gobj **pptVar6;
  _glist *glist_00;
  t_word *in_R8;
  long lVar7;
  _outlet **wp;
  t_gpointer local_48;
  
  pptVar6 = &glist->gl_list;
  do {
    glist_00 = (_glist *)*pptVar6;
    if (glist_00 == (_glist *)0x0) {
      return;
    }
    p_Var1 = (glist_00->gl_obj).te_g.g_pd;
    if (p_Var1 == scalar_class) {
      s = (t_symbol *)(glist_00->gl_obj).te_binbuf;
      if (s == tfrom->t_sym) {
        gpointer_init(&local_48);
        x = (_glist *)getbytes((long)tto->t_n * 8 + 0x18);
        (x->gl_obj).te_g.g_pd = scalar_class;
        (x->gl_obj).te_binbuf = (_binbuf *)tfrom->t_sym;
        gpointer_setglist(&local_48,glist,(t_scalar *)x);
        wp = &(x->gl_obj).te_outlet;
        word_init((t_word *)wp,tto,&local_48);
        template_conformwords
                  (tto,(t_template *)conformaction,(int *)&(glist_00->gl_obj).te_outlet,(t_word *)wp
                   ,in_R8);
        p_Var2 = (_glist *)glist->gl_list;
        if ((_glist *)glist->gl_list == glist_00) {
          glist->gl_list = (t_gobj *)x;
          (x->gl_obj).te_g.g_next = (glist_00->gl_obj).te_g.g_next;
        }
        else {
          do {
            p_Var4 = p_Var2;
            p_Var2 = (_glist *)(p_Var4->gl_obj).te_g.g_next;
            if (p_Var2 == (_glist *)0x0) {
              bug("template_conformscalar");
              goto LAB_00152b62;
            }
          } while (p_Var2 != glist_00);
          (x->gl_obj).te_g.g_next = (p_Var2->gl_obj).te_g.g_next;
          (p_Var4->gl_obj).te_g.g_next = (_gobj *)x;
        }
LAB_00152b62:
        pd_free((t_pd *)glist_00);
        ptVar3 = tto;
      }
      else {
        ptVar3 = template_findbyname(s);
        x = glist_00;
      }
      lVar7 = 0;
      for (lVar5 = 0; glist_00 = x, lVar5 < ptVar3->t_n; lVar5 = lVar5 + 1) {
        if (*(int *)((long)&ptVar3->t_vec->ds_type + lVar7) == 3) {
          template_conformarray(tfrom,tto,conformaction,(_array *)(&(x->gl_obj).te_outlet)[lVar5]);
        }
        lVar7 = lVar7 + 0x18;
      }
    }
    else if (p_Var1 == canvas_class) {
      template_conformglist(tfrom,tto,glist_00,conformaction);
    }
    else if (p_Var1 == garray_class) {
      a = garray_getarray((_garray *)glist_00);
      template_conformarray(tfrom,tto,conformaction,a);
    }
    pptVar6 = &(glist_00->gl_obj).te_g.g_next;
  } while( true );
}

Assistant:

static void template_conformglist(t_template *tfrom, t_template *tto,
    t_glist *glist,  int *conformaction)
{
    t_gobj *g;
    /* post("conform glist %s", glist->gl_name->s_name); */
    for (g = glist->gl_list; g; g = g->g_next)
    {
        if (pd_class(&g->g_pd) == scalar_class)
            g = &template_conformscalar(tfrom, tto, conformaction,
                glist, (t_scalar *)g)->sc_gobj;
        else if (pd_class(&g->g_pd) == canvas_class)
            template_conformglist(tfrom, tto, (t_glist *)g, conformaction);
        else if (pd_class(&g->g_pd) == garray_class)
            template_conformarray(tfrom, tto, conformaction,
                garray_getarray((t_garray *)g));
    }
}